

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O1

AggregateFunction *
duckdb::ContinuousQuantileFunction::GetAggregate
          (AggregateFunction *__return_storage_ptr__,LogicalType *type)

{
  GetContinuousQuantileTemplated<duckdb::ScalarContinuousQuantile>(__return_storage_ptr__,type);
  ::std::__cxx11::string::_M_replace
            ((ulong)&(__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.
                     super_Function.name,0,
             (char *)(__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.
                     super_Function.name._M_string_length,0x1e2021c);
  __return_storage_ptr__->bind = Bind;
  __return_storage_ptr__->serialize = QuantileBindData::Serialize;
  __return_storage_ptr__->deserialize = Deserialize;
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)
             &(__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.arguments,
             &LogicalType::DOUBLE);
  __return_storage_ptr__->order_dependent = NOT_ORDER_DEPENDENT;
  return __return_storage_ptr__;
}

Assistant:

static AggregateFunction GetAggregate(const LogicalType &type) {
		auto fun = GetContinuousQuantile(type);
		fun.name = "quantile_cont";
		fun.bind = Bind;
		fun.serialize = QuantileBindData::Serialize;
		fun.deserialize = Deserialize;
		// temporarily push an argument so we can bind the actual quantile
		fun.arguments.emplace_back(LogicalType::DOUBLE);
		fun.order_dependent = AggregateOrderDependent::NOT_ORDER_DEPENDENT;
		return fun;
	}